

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

Gia_Man_t * Lf_ManDeriveMappingCoarse(Lf_Man_t *p)

{
  Gia_Man_t *p_00;
  Jf_Par_t *pJVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iLit1;
  Gia_Man_t *p_01;
  char *pcVar6;
  Vec_Int_t *pVVar7;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar8;
  Lf_Cut_t *pLVar9;
  ulong uVar10;
  long lVar11;
  
  if ((p->pPars->fCutMin != 0) || (p_00 = p->pGia, p_00->pMuxes == (uint *)0x0)) {
    __assert_fail("!p->pPars->fCutMin && pGia->pMuxes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                  ,0x6cc,"Gia_Man_t *Lf_ManDeriveMappingCoarse(Lf_Man_t *)");
  }
  p_01 = Gia_ManStart(p_00->nObjs);
  pcVar6 = Abc_UtilStrsav(p_00->pName);
  p_01->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p_00->pSpec);
  p_01->pSpec = pcVar6;
  pJVar1 = p->pPars;
  pVVar7 = Vec_IntAlloc(p_00->nObjs + (int)pJVar1->Edge + (int)pJVar1->Mux7 * 4 +
                        (p_00->nMuxes + p_00->nXors + (int)pJVar1->Area) * 2);
  p_01->vMapping = pVVar7;
  Vec_IntFill(pVVar7,(p_00->nMuxes + p_00->nXors) * 2 + p_00->nObjs,0);
  p_00->pObjs->Value = 0;
  for (lVar11 = 1; lVar11 < p_00->nObjs; lVar11 = lVar11 + 1) {
    iVar4 = (int)lVar11;
    pObj = Gia_ManObj(p_00,iVar4);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar2 = (uint)*(undefined8 *)pObj;
    if ((~uVar2 & 0x9fffffff) == 0) {
      uVar2 = Gia_ManAppendCi(p_01);
LAB_005c8962:
      pObj->Value = uVar2;
    }
    else {
      if ((~uVar2 & 0x1fffffff) != 0 && (int)uVar2 < 0) {
        iVar4 = Gia_ObjFanin0Copy(pObj);
        uVar2 = Gia_ManAppendCo(p_01,iVar4);
        goto LAB_005c8962;
      }
      iVar3 = Gia_ObjIsBuf(pObj);
      if (iVar3 != 0) {
        iVar4 = Gia_ObjFanin0Copy(pObj);
        uVar2 = Gia_ManAppendBuf(p_01,iVar4);
        goto LAB_005c8962;
      }
      if ((p_00->pMuxes == (uint *)0x0) || (p_00->pMuxes[lVar11] == 0)) {
        iVar5 = Gia_ObjIsXor(pObj);
        iVar3 = Gia_ObjFanin0Copy(pObj);
        iLit1 = Gia_ObjFanin1Copy(pObj);
        if (iVar5 != 0) {
          iVar5 = Abc_LitNot(iLit1);
          goto LAB_005c89fc;
        }
        uVar2 = Gia_ManAppendAnd(p_01,iVar3,iLit1);
      }
      else {
        pGVar8 = Gia_ObjFanin2(p_00,pObj);
        uVar2 = pGVar8->Value;
        iVar3 = Gia_ObjFaninC2(p_00,pObj);
        iVar3 = Abc_LitNotCond(uVar2,iVar3);
        iVar5 = Gia_ObjFanin1Copy(pObj);
        iLit1 = Gia_ObjFanin0Copy(pObj);
LAB_005c89fc:
        uVar2 = Gia_ManAppendMux(p_01,iVar3,iVar5,iLit1);
      }
      pObj->Value = uVar2;
      iVar3 = Lf_ObjMapRefNum(p,iVar4);
      if (iVar3 != 0) {
        pLVar9 = Lf_ObjCutBest(p,iVar4);
        pVVar7 = p_01->vMapping;
        iVar4 = Abc_Lit2Var(pObj->Value);
        Vec_IntWriteEntry(pVVar7,iVar4,p_01->vMapping->nSize);
        Vec_IntPush(p_01->vMapping,(uint)(byte)pLVar9->field_0x17);
        uVar10 = 0;
        while( true ) {
          uVar2 = *(uint *)&pLVar9->field_0x14;
          pVVar7 = p_01->vMapping;
          if (uVar2 >> 0x18 <= uVar10) break;
          pGVar8 = Gia_ManObj(p_00,*(int *)((long)&pLVar9[1].Sign + uVar10 * 4));
          iVar4 = Abc_Lit2Var(pGVar8->Value);
          Vec_IntPush(pVVar7,iVar4);
          uVar10 = uVar10 + 1;
        }
        iVar3 = Abc_Lit2Var(pObj->Value);
        iVar4 = -iVar3;
        if ((uVar2 >> 0x17 & 1) == 0) {
          iVar4 = iVar3;
        }
        Vec_IntPush(pVVar7,iVar4);
      }
    }
  }
  Gia_ManSetRegNum(p_01,p_00->nRegs);
  iVar4 = p_01->vMapping->nCap;
  if ((iVar4 != 0x10) && (p_01->vMapping->nSize != iVar4)) {
    __assert_fail("Vec_IntCap(pNew->vMapping) == 16 || Vec_IntSize(pNew->vMapping) == Vec_IntCap(pNew->vMapping)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                  ,0x6ee,"Gia_Man_t *Lf_ManDeriveMappingCoarse(Lf_Man_t *)");
  }
  return p_01;
}

Assistant:

Gia_Man_t * Lf_ManDeriveMappingCoarse( Lf_Man_t * p )
{
    Gia_Man_t * pNew, * pGia = p->pGia;
    Gia_Obj_t * pObj;
    Lf_Cut_t * pCut;
    int i, k;
    assert( !p->pPars->fCutMin && pGia->pMuxes );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(pGia) );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    // start mapping
    pNew->vMapping = Vec_IntAlloc( Gia_ManObjNum(pGia) + 2*Gia_ManXorNum(pGia) + 2*Gia_ManMuxNum(pGia) + (int)p->pPars->Edge + 2*(int)p->pPars->Area + 4*(int)p->pPars->Mux7 );
    Vec_IntFill( pNew->vMapping, Gia_ManObjNum(pGia) + 2*Gia_ManXorNum(pGia) + 2*Gia_ManMuxNum(pGia), 0 );
    // process objects
    Gia_ManConst0(pGia)->Value = 0;
    Gia_ManForEachObj1( pGia, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            { pObj->Value = Gia_ManAppendCi( pNew ); continue; }
        if ( Gia_ObjIsCo(pObj) )
            { pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) ); continue; }
        if ( Gia_ObjIsBuf(pObj) )
            { pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) ); continue; }
        if ( Gia_ObjIsMuxId(pGia, i) )
            pObj->Value = Gia_ManAppendMux( pNew, Gia_ObjFanin2Copy(pGia, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( !Lf_ObjMapRefNum(p, i) )
            continue;
        pCut = Lf_ObjCutBest( p, i );
        Vec_IntWriteEntry( pNew->vMapping, Abc_Lit2Var(pObj->Value), Vec_IntSize(pNew->vMapping) );
        Vec_IntPush( pNew->vMapping, pCut->nLeaves );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Vec_IntPush( pNew->vMapping, Abc_Lit2Var(Gia_ManObj(pGia, pCut->pLeaves[k])->Value) );
        Vec_IntPush( pNew->vMapping, pCut->fMux7 ? -Abc_Lit2Var(pObj->Value) : Abc_Lit2Var(pObj->Value) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pGia) );
    assert( Vec_IntCap(pNew->vMapping) == 16 || Vec_IntSize(pNew->vMapping) == Vec_IntCap(pNew->vMapping) );
    return pNew;
}